

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplevm.cpp
# Opt level: O2

void __thiscall BrainFuckVM::BrainFuckVM(BrainFuckVM *this,int32_t *program,size_t sz)

{
  uint8_t *__s;
  int32_t *__dest;
  
  __s = (uint8_t *)operator_new__(30000);
  this->tape_ = __s;
  this->data_ptr_ = 0;
  __dest = (int32_t *)operator_new__(-(ulong)(sz >> 0x3e != 0) | sz * 4);
  this->program_ = __dest;
  this->instructions_ = (int)(sz >> 1);
  this->pc_ = 0;
  memset(__s,0,30000);
  memcpy(__dest,program,sz * 4);
  return;
}

Assistant:

BrainFuckVM(int32_t *program, size_t sz) :
            tape_(new uint8_t[TAPE_SIZE]),
            data_ptr_(0),
            program_(new int32_t[sz]),
            pc_(0),
            instructions_(sz / 2)
    {
        memset(tape_, 0, TAPE_SIZE);
        memcpy(program_, program, sizeof(int32_t) * sz);
    }